

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O2

RGB __thiscall
RayTracer::processPixelOnPlane
          (RayTracer *this,Point *rayBeg,Point *pointOnPlane,const_iterator planeIt,
          int recursionLevel)

{
  Point *light;
  bool bVar1;
  RGB RVar2;
  RGB reflectedColor;
  Segment local_70;
  undefined1 local_58 [8];
  Segment refl;
  
  light = &(this->super_RayTracerBase).config.super_BaseConfig.light;
  refl.b._4_8_ = rayBeg;
  bVar1 = pointInShadow<__gnu_cxx::__normal_iterator<Plane_const*,std::vector<Plane,std::allocator<Plane>>>>
                    (pointOnPlane,light,
                     (this->super_RayTracerBase).config.planes.
                     super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                     planeIt._M_current);
  if (!bVar1) {
    bVar1 = pointInShadow<__gnu_cxx::__normal_iterator<Plane_const*,std::vector<Plane,std::allocator<Plane>>>>
                      (pointOnPlane,light,planeIt._M_current + 1,
                       (this->super_RayTracerBase).config.planes.
                       super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if (!bVar1) {
      bVar1 = pointInShadow<__gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>>
                        (pointOnPlane,light,
                         (this->super_RayTracerBase).config.spheres.
                         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->super_RayTracerBase).config.spheres.
                         super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if (!bVar1) {
        RVar2 = (planeIt._M_current)->color;
        _local_58 = operator-((this->super_RayTracerBase).config.super_BaseConfig.light,pointOnPlane
                             );
        RVar2 = calculateColorInLight(this,RVar2,&(planeIt._M_current)->normal,(Vector *)local_58);
        goto LAB_001062b8;
      }
    }
  }
  RVar2 = operator*((planeIt._M_current)->color,
                    (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient);
LAB_001062b8:
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS((planeIt._M_current)->reflectionCoefficient))) {
    local_70.a.z = *(float *)(refl.b._4_8_ + 8);
    local_70.a._0_8_ = *(undefined8 *)refl.b._4_8_;
    local_70.b.x = pointOnPlane->x;
    local_70.b.y = pointOnPlane->y;
    local_70.b.z = pointOnPlane->z;
    reflection((Segment *)local_58,&local_70,planeIt._M_current);
    reflectedColor = processPixel(this,(Segment *)local_58,recursionLevel + 1);
    RVar2 = calculateColorFromReflection
                      (RVar2,reflectedColor,(planeIt._M_current)->reflectionCoefficient);
  }
  return RVar2;
}

Assistant:

RGB RayTracer::processPixelOnPlane(Point const& rayBeg, Point const& pointOnPlane,
                                   std::vector<Plane>::const_iterator planeIt, int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnPlane, config.light, config.planes.cbegin(), planeIt)
      || pointInShadow(pointOnPlane, config.light, planeIt + 1, config.planes.cend())
      || pointInShadow(pointOnPlane, config.light, config.spheres.cbegin(), config.spheres.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = planeIt->color * config.ambientCoefficient;
  else
    resultCol = calculateColorInLight(planeIt->color, planeIt->normal, config.light - pointOnPlane);

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(planeIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnPlane}, *planeIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, planeIt->reflectionCoefficient);
}